

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLock::BuildLinkType(ChLinkLock *this,LinkType link_type)

{
  bool z;
  bool y;
  bool x;
  bool e1;
  bool e2;
  bool e3;
  
  this->type = link_type;
  switch(link_type) {
  case LOCK:
    x = true;
    y = true;
    break;
  case SPHERICAL:
    x = true;
    goto LAB_00581a6b;
  case POINTPLANE:
    x = false;
    y = false;
    goto LAB_00581a70;
  case POINTLINE:
    x = false;
LAB_00581a6b:
    y = true;
LAB_00581a70:
    z = true;
LAB_00581a75:
    e2 = false;
    e1 = false;
    e3 = e2;
    goto LAB_00581ade;
  case CYLINDRICAL:
    x = true;
    y = true;
    goto LAB_00581a58;
  case PRISMATIC:
    x = true;
    y = true;
    goto LAB_00581a9d;
  case PLANEPLANE:
    x = false;
    y = false;
    goto LAB_00581ab1;
  case OLDHAM:
    x = false;
    y = false;
    break;
  case REVOLUTE:
    x = true;
    goto LAB_00581aac;
  default:
    x = false;
    y = false;
    z = false;
    goto LAB_00581a75;
  case ALIGN:
    x = false;
    y = false;
LAB_00581a9d:
    z = false;
    goto LAB_00581ad3;
  case PARALLEL:
    x = false;
    y = false;
LAB_00581a58:
    z = false;
LAB_00581ab6:
    e1 = true;
    e2 = true;
    e3 = false;
    goto LAB_00581ade;
  case PERPEND:
    e1 = true;
    x = false;
    y = false;
    z = false;
    e2 = false;
    e3 = true;
    goto LAB_00581ade;
  case REVOLUTEPRISMATIC:
    x = false;
LAB_00581aac:
    y = true;
LAB_00581ab1:
    z = true;
    goto LAB_00581ab6;
  }
  z = true;
LAB_00581ad3:
  e2 = true;
  e1 = true;
  e3 = e2;
LAB_00581ade:
  ChLinkMaskLF::SetLockMask(&this->mask,x,y,z,false,e1,e2,e3);
  BuildLink(this);
  return;
}

Assistant:

void ChLinkLock::BuildLinkType(LinkType link_type) {
    type = link_type;

    // SetLockMask() sets the constraints for the link coordinates: (X,Y,Z, E0,E1,E2,E3)
    switch (type) {
        case LinkType::FREE:
            BuildLink(false, false, false, false, false, false, false);
            break;
        case LinkType::LOCK:
            // this should never happen
            BuildLink(true, true, true, false, true, true, true);
            break;
        case LinkType::SPHERICAL:
            BuildLink(true, true, true, false, false, false, false);
            break;
        case LinkType::POINTPLANE:
            BuildLink(false, false, true, false, false, false, false);
            break;
        case LinkType::POINTLINE:
            BuildLink(false, true, true, false, false, false, false);
            break;
        case LinkType::REVOLUTE:
            BuildLink(true, true, true, false, true, true, false);
            break;
        case LinkType::CYLINDRICAL:
            BuildLink(true, true, false, false, true, true, false);
            break;
        case LinkType::PRISMATIC:
            BuildLink(true, true, false, false, true, true, true);
            break;
        case LinkType::PLANEPLANE:
            BuildLink(false, false, true, false, true, true, false);
            break;
        case LinkType::OLDHAM:
            BuildLink(false, false, true, false, true, true, true);
            break;
        case LinkType::ALIGN:
            BuildLink(false, false, false, false, true, true, true);
            break;
        case LinkType::PARALLEL:
            BuildLink(false, false, false, false, true, true, false);
            break;
        case LinkType::PERPEND:
            BuildLink(false, false, false, false, true, false, true);
            break;
        case LinkType::REVOLUTEPRISMATIC:
            BuildLink(false, true, true, false, true, true, false);
            break;
        default:
            BuildLink(false, false, false, false, false, false, false);
            break;
    }
}